

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O0

uint32_t FACTWave_SetPitch(FACTWave *pWave,int16_t pitch)

{
  short in_SI;
  long in_RDI;
  uint32_t in_stack_ffffffffffffffe0;
  float in_stack_ffffffffffffffe4;
  float fVar1;
  undefined2 in_stack_ffffffffffffffec;
  undefined4 local_4;
  
  if (in_RDI == 0) {
    local_4 = 1;
  }
  else {
    FAudio_PlatformLockMutex((FAudioMutex)0x11647d);
    if (in_SI < 0x961) {
      if (in_SI < -0x960) {
        in_stack_ffffffffffffffe4 = -NAN;
        fVar1 = in_stack_ffffffffffffffe4;
      }
      else {
        in_stack_ffffffffffffffe4 = (float)(int)in_SI;
        fVar1 = in_stack_ffffffffffffffe4;
      }
    }
    else {
      fVar1 = 3.36312e-42;
    }
    *(short *)(in_RDI + 0x28) = SUB42(fVar1,0);
    SDL_pow(0x4000000000000000,(double)(int)*(short *)(in_RDI + 0x28) / 1200.0);
    FAudioSourceVoice_SetFrequencyRatio
              ((FAudioSourceVoice *)CONCAT26(in_SI,CONCAT24(in_stack_ffffffffffffffec,fVar1)),
               in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0);
    FAudio_PlatformUnlockMutex((FAudioMutex)0x116525);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

uint32_t FACTWave_SetPitch(FACTWave *pWave, int16_t pitch)
{
	if (pWave == NULL)
	{
		return 1;
	}
	FAudio_PlatformLockMutex(pWave->parentBank->parentEngine->apiLock);
	pWave->pitch = FAudio_clamp(
		pitch,
		FACTPITCH_MIN_TOTAL,
		FACTPITCH_MAX_TOTAL
	);
	FAudioSourceVoice_SetFrequencyRatio(
		pWave->voice,
		(float) FAudio_pow(2.0, pWave->pitch / 1200.0),
		0
	);
	FAudio_PlatformUnlockMutex(pWave->parentBank->parentEngine->apiLock);
	return 0;
}